

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tls.c
# Opt level: O0

void al_set_target_bitmap(ALLEGRO_BITMAP *bitmap)

{
  ALLEGRO_DISPLAY *pAVar1;
  thread_local_state *ptVar2;
  ALLEGRO_BITMAP *in_RDI;
  int bitmap_flags;
  _Bool same_shader;
  ALLEGRO_SHADER *new_shader;
  ALLEGRO_SHADER *old_shader;
  ALLEGRO_DISPLAY *new_display;
  ALLEGRO_DISPLAY *old_display;
  thread_local_state *tls;
  bool local_3d;
  uint local_3c;
  undefined4 in_stack_ffffffffffffffcc;
  uint uVar3;
  ALLEGRO_SHADER *local_30;
  ALLEGRO_SHADER *local_28;
  ALLEGRO_DISPLAY *local_20;
  
  if (in_RDI == (ALLEGRO_BITMAP *)0x0) {
    local_3c = 0;
  }
  else {
    local_3c = al_get_bitmap_flags(in_RDI);
    if (in_RDI->parent == (ALLEGRO_BITMAP *)0x0) {
      in_RDI->dirty = true;
    }
    else {
      in_RDI->parent->dirty = true;
    }
  }
  ptVar2 = tls_get();
  if (ptVar2 != (thread_local_state *)0x0) {
    pAVar1 = ptVar2->current_display;
    if (ptVar2->target_bitmap == (ALLEGRO_BITMAP *)0x0) {
      local_28 = (ALLEGRO_SHADER *)0x0;
    }
    else {
      local_28 = ptVar2->target_bitmap->shader;
    }
    if (in_RDI == (ALLEGRO_BITMAP *)0x0) {
      local_20 = (ALLEGRO_DISPLAY *)0x0;
      local_30 = (ALLEGRO_SHADER *)0x0;
    }
    else if ((local_3c & 1) == 0) {
      local_20 = _al_get_bitmap_display(in_RDI);
      local_30 = in_RDI->shader;
    }
    else {
      local_30 = (ALLEGRO_SHADER *)0x0;
      local_20 = pAVar1;
    }
    local_3d = local_28 == local_30 && pAVar1 == local_20;
    uVar3 = CONCAT13(local_3d,(int3)in_stack_ffffffffffffffcc);
    if ((local_28 != (ALLEGRO_SHADER *)0x0) && (local_28 != local_30 || pAVar1 != local_20)) {
      (*local_28->vt->unuse_shader)(local_28,pAVar1);
    }
    if (pAVar1 != local_20) {
      if (((pAVar1 != (ALLEGRO_DISPLAY *)0x0) && (pAVar1->vt != (ALLEGRO_DISPLAY_INTERFACE *)0x0))
         && (pAVar1->vt->unset_current_display != (_func_void_ALLEGRO_DISPLAY_ptr *)0x0)) {
        (*pAVar1->vt->unset_current_display)(pAVar1);
      }
      ptVar2->current_display = local_20;
      if (((local_20 != (ALLEGRO_DISPLAY *)0x0) &&
          (local_20->vt != (ALLEGRO_DISPLAY_INTERFACE *)0x0)) &&
         (local_20->vt->set_current_display != (_func__Bool_ALLEGRO_DISPLAY_ptr *)0x0)) {
        (*local_20->vt->set_current_display)(local_20);
      }
    }
    ptVar2->target_bitmap = in_RDI;
    if (((in_RDI != (ALLEGRO_BITMAP *)0x0) && ((local_3c & 1) == 0)) &&
       ((local_20 != (ALLEGRO_DISPLAY *)0x0 &&
        ((local_20->vt != (ALLEGRO_DISPLAY_INTERFACE *)0x0 &&
         (local_20->vt->set_target_bitmap !=
          (_func_void_ALLEGRO_DISPLAY_ptr_ALLEGRO_BITMAP_ptr *)0x0)))))) {
      (*local_20->vt->set_target_bitmap)(local_20,in_RDI);
      if (((uVar3 & 0x1000000) == 0) || (local_30 == (ALLEGRO_SHADER *)0x0)) {
        al_use_shader((ALLEGRO_SHADER *)CONCAT44(uVar3,local_3c));
      }
      (*local_20->vt->update_transformation)(local_20,in_RDI);
    }
  }
  return;
}

Assistant:

void al_set_target_bitmap(ALLEGRO_BITMAP *bitmap)
{
   thread_local_state *tls;
   ALLEGRO_DISPLAY *old_display;
   ALLEGRO_DISPLAY *new_display;
   ALLEGRO_SHADER *old_shader;
   ALLEGRO_SHADER *new_shader;
   bool same_shader;
   int bitmap_flags = bitmap ? al_get_bitmap_flags(bitmap) : 0;

   ASSERT(!al_is_bitmap_drawing_held());

   if (bitmap) {
      if (bitmap->parent) {
         bitmap->parent->dirty = true;
      }
      else {
         bitmap->dirty = true;
      }
   }

   if ((tls = tls_get()) == NULL)
      return;

   old_display = tls->current_display;

   if (tls->target_bitmap)
      old_shader = tls->target_bitmap->shader;
   else
      old_shader = NULL;

   if (bitmap == NULL) {
      /* Explicitly releasing the current rendering context. */
      new_display = NULL;
      new_shader = NULL;
   }
   else if (bitmap_flags & ALLEGRO_MEMORY_BITMAP) {
      /* Setting a memory bitmap doesn't change the rendering context. */
      new_display = old_display;
      new_shader = NULL;
   }
   else {
      new_display = _al_get_bitmap_display(bitmap);
      new_shader = bitmap->shader;
   }

   same_shader = (old_shader == new_shader && old_display == new_display);

   /* Unset the old shader if necessary. */
   if (old_shader && !same_shader) {
      old_shader->vt->unuse_shader(old_shader, old_display);
   }

   /* Change the rendering context if necessary. */
   if (old_display != new_display) {
      if (old_display &&
            old_display->vt &&
            old_display->vt->unset_current_display) {
         old_display->vt->unset_current_display(old_display);
      }

      tls->current_display = new_display;

      if (new_display &&
            new_display->vt &&
            new_display->vt->set_current_display) {
         new_display->vt->set_current_display(new_display);
      }
   }

   /* Change the target bitmap itself. */
   tls->target_bitmap = bitmap;

   if (bitmap &&
         !(bitmap_flags & ALLEGRO_MEMORY_BITMAP) &&
         new_display &&
         new_display->vt &&
         new_display->vt->set_target_bitmap)
   {
      new_display->vt->set_target_bitmap(new_display, bitmap);

      /* Set the new shader if necessary.  This should done before the
       * update_transformation call, which will also update the shader's
       * al_projview_matrix variable.
       */
      if (!same_shader || !new_shader) {
         al_use_shader(new_shader);
      }

      new_display->vt->update_transformation(new_display, bitmap);
   }
}